

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.cpp
# Opt level: O1

void __thiscall Refal2::CInternalProgramBuilder::check(CInternalProgramBuilder *this)

{
  CKeyDataPair *pCVar1;
  CErrorsHelper *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  ostringstream stringStream;
  string local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  if (0 < (this->globals).size) {
    lVar5 = 0x10;
    lVar4 = 0;
    do {
      pCVar1 = (this->globals).keyDataPairs;
      if (*(long *)((long)pCVar1 + lVar5 + -8) == 0 &&
          *(long *)((long)&(pCVar1->key)._M_node + lVar5) == 0) {
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"external function `",0x13);
        pbVar2 = CDictionary<Refal2::CGlobalFunctionData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::GetKey(&this->globals,(int)lVar4);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(pbVar2->_M_dataplus)._M_p,pbVar2->_M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,"` was not defined in program",0x1c);
        this_00 = this->errors;
        std::__cxx11::stringbuf::str();
        CErrorsHelper::RaiseError(this_00,ES_LinkError,&local_1c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x30;
    } while (lVar4 < (this->globals).size);
  }
  return;
}

Assistant:

void CInternalProgramBuilder::check()
{
	for( int globalIndex = 0; globalIndex < globals.Size(); globalIndex++ )
	{
		if( !globals.GetData( globalIndex ).IsDefined() ) {
			std::ostringstream stringStream;
			stringStream << "external function `"
				<< globals.GetKey( globalIndex ) <<
				"` was not defined in program";
			errors.RaiseError( ES_LinkError, stringStream.str() );
		}
	}
}